

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

Snapshot * __thiscall
cmState::CreateMacroCallSnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot,
          string *entryPointCommand,long entryPointLine,string *fileName)

{
  PositionType position;
  iterator it;
  bool bVar1;
  ReferenceType pSVar2;
  PointerType pSVar3;
  PointerType pBVar4;
  PointerType pSVar5;
  iterator iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_168;
  PositionType PStack_160;
  iterator local_150;
  SnapshotDataType local_130;
  cmLinkedTree<cmState::SnapshotDataType> *local_48;
  PositionType PStack_40;
  undefined1 local_38 [8];
  PositionType pos;
  string *fileName_local;
  long entryPointLine_local;
  string *entryPointCommand_local;
  cmState *this_local;
  
  local_48 = originSnapshot.Position.Tree;
  PStack_40 = originSnapshot.Position.Position;
  pos.Position = (PositionType)fileName;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*(&originSnapshot.Position);
  SnapshotDataType::SnapshotDataType(&local_130,pSVar2);
  iVar6.Position = PStack_40;
  iVar6.Tree = local_48;
  iVar6 = cmLinkedTree<cmState::SnapshotDataType>::Push(&this->SnapshotData,iVar6,&local_130);
  pos.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)iVar6.Position;
  local_38 = (undefined1  [8])iVar6.Tree;
  SnapshotDataType::~SnapshotDataType(&local_130);
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  pSVar3->EntryPointLine = entryPointLine;
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  std::__cxx11::string::operator=((string *)&pSVar3->EntryPointCommand,(string *)entryPointCommand);
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  pSVar3->SnapshotType = MacroCallType;
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  pSVar3->Keep = false;
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  local_168 = (pSVar3->ExecutionListFile).Tree;
  PStack_160 = (pSVar3->ExecutionListFile).Position;
  std::__cxx11::string::string((string *)&local_188,(string *)pos.Position);
  it.Position = PStack_160;
  it.Tree = local_168;
  local_150 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Push(&this->ExecutionListFiles,it,&local_188);
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  pSVar3->ExecutionListFile = local_150;
  std::__cxx11::string::~string((string *)&local_188);
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  bVar1 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar3->Vars);
  if (!bVar1) {
    __assert_fail("originSnapshot.Position->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x39f,
                  "cmState::Snapshot cmState::CreateMacroCallSnapshot(cmState::Snapshot, const std::string &, long, const std::string &)"
                 );
  }
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  (pBVar4->DirectoryEnd).Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_38;
  (pBVar4->DirectoryEnd).Position = (PositionType)pos.Tree;
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  (pSVar5->PolicyScope).Tree = (pSVar3->Policies).Tree;
  (pSVar5->PolicyScope).Position = (pSVar3->Policies).Position;
  position.Position = (PositionType)pos.Tree;
  position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_38;
  Snapshot::Snapshot(__return_storage_ptr__,this,position);
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot
cmState::CreateMacroCallSnapshot(cmState::Snapshot originSnapshot,
                                    std::string const& entryPointCommand,
                                    long entryPointLine,
                                    std::string const& fileName)
{
  PositionType pos = this->SnapshotData.Push(originSnapshot.Position,
                                             *originSnapshot.Position);
  pos->EntryPointLine = entryPointLine;
  pos->EntryPointCommand = entryPointCommand;
  pos->SnapshotType = MacroCallType;
  pos->Keep = false;
  pos->ExecutionListFile = this->ExecutionListFiles.Push(
        originSnapshot.Position->ExecutionListFile, fileName);
  assert(originSnapshot.Position->Vars.IsValid());
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  return cmState::Snapshot(this, pos);
}